

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O0

sexp simplify(sexp ctx,sexp ast,sexp init_substs,sexp lambda)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  bool bVar4;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp ctx2;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp app;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp substs;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp sv;
  sexp p2;
  sexp p1;
  sexp ls2;
  sexp ls1;
  int check;
  sexp in_stack_fffffffffffffec8;
  sexp in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffedf;
  sexp in_stack_fffffffffffffee0;
  sexp in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  sexp in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar6;
  sexp in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  sexp_gc_var_t local_d0;
  sexp local_c0;
  sexp_gc_var_t local_b8;
  sexp local_a8;
  sexp_gc_var_t local_a0;
  sexp local_90;
  sexp_gc_var_t local_88;
  sexp_conflict local_78;
  sexp_gc_var_t local_70;
  sexp local_60;
  sexp local_58;
  sexp local_50;
  sexp local_48;
  sexp local_40;
  sexp local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  sexp ast_00;
  sexp local_8;
  
  local_60 = (sexp)0x43e;
  memset(&local_70,0,0x10);
  local_78 = (sexp_conflict)0x43e;
  memset(&local_88,0,0x10);
  local_90 = (sexp)&DAT_0000043e;
  memset(&local_a0,0,0x10);
  local_a8 = (sexp)0x43e;
  memset(&local_b8,0,0x10);
  local_c0 = (sexp)0x43e;
  local_38 = in_RDX;
  psVar3 = in_RSI;
  memset(&local_d0,0,0x10);
  local_60 = psVar3;
  local_8 = local_60;
  if (((ulong)local_60 & 3) == 0) {
    local_70.var = &local_60;
    local_70.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_70;
    local_88.var = &local_78;
    local_88.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_88;
    local_a0.var = &local_90;
    local_a0.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_a0;
    local_b8.var = &local_a8;
    local_b8.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_b8;
    local_d0.var = &local_c0;
    local_d0.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_d0;
    switch(local_60->tag) {
    case 6:
      psVar3 = in_RDI;
      psVar2 = local_60;
      if ((((local_60->value).stack.length & 3) == 0) &&
         (((local_60->value).type.name)->tag == 0x1c)) {
        psVar1 = (sexp)(local_60->value).flonum;
        ast_00 = local_38;
      }
      else {
        psVar1 = simplify(local_60,local_38,in_RCX,
                          (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        local_90 = psVar1;
        ast_00 = local_38;
      }
      local_a8 = sexp_cons_op(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              CONCAT17(in_stack_fffffffffffffedf,
                                       CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)
                                      ),in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      (local_a8->value).type.slots = (local_60->value).type.slots;
      local_38 = (local_60->value).type.cpl;
      while( true ) {
        uVar5 = false;
        if (((ulong)local_38 & 3) == 0) {
          uVar5 = local_38->tag == 6;
        }
        if ((bool)uVar5 == false) break;
        in_stack_ffffffffffffff08 = in_RDI;
        local_90 = simplify(psVar2,ast_00,in_RCX,
                            (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        sexp_push_op((sexp)CONCAT17(in_stack_fffffffffffffedf,
                                    CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                     (sexp_conflict *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if ((((ulong)local_a8 & 3) == 0) && (local_a8->tag == 6)) {
          (local_a8->value).type.slots = (local_38->value).type.slots;
        }
        local_38 = (local_38->value).type.cpl;
      }
      local_a8 = sexp_nreverse_op(in_stack_fffffffffffffef8,
                                  (sexp)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0
                                                ),(sexp_sint_t)in_stack_fffffffffffffee8,
                                  in_stack_fffffffffffffee0);
      if ((((local_a8->value).stack.length & 3) == 0) &&
         (((local_a8->value).type.name)->tag == 0x1b)) {
        if ((((local_a8->value).type.name)->value).flonum_bits[0x58] == '\x04') {
          bVar4 = true;
          local_38 = (local_a8->value).type.cpl;
          while( true ) {
            uVar6 = false;
            if (((ulong)local_38 & 3) == 0) {
              uVar6 = local_38->tag == 6;
            }
            if ((bool)uVar6 == false) goto LAB_00154b14;
            if ((((local_38->value).stack.length & 3) == 0) &&
               ((((local_38->value).stack.length & 3) != 0 ||
                (((local_38->value).type.name)->tag != 0x22)))) break;
            local_38 = (local_38->value).type.cpl;
          }
          bVar4 = false;
LAB_00154b14:
          if (bVar4) {
            local_c0 = sexp_make_eval_context
                                 (in_stack_ffffffffffffff08,
                                  (sexp)CONCAT17(uVar6,in_stack_ffffffffffffff00),
                                  in_stack_fffffffffffffef8,
                                  CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                                  (sexp_uint_t)in_stack_fffffffffffffee8);
            sexp_generate((sexp_conflict)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                          (sexp_conflict)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                          in_stack_fffffffffffffed0);
            local_60 = sexp_complete_bytecode(in_stack_fffffffffffffec8);
            if ((((ulong)local_60 & 3) != 0) || (local_60->tag != 0x13)) {
              psVar2 = sexp_make_vector_op(in_stack_ffffffffffffff08,
                                           (sexp)CONCAT17(uVar6,in_stack_ffffffffffffff00),
                                           (sexp_sint_t)in_stack_fffffffffffffef8,
                                           (sexp)CONCAT17(in_stack_fffffffffffffef7,
                                                          in_stack_fffffffffffffef0),
                                           in_stack_fffffffffffffee8);
              local_90 = psVar2;
              local_90 = sexp_make_procedure_op
                                   ((sexp)CONCAT17(in_stack_fffffffffffffef7,
                                                   in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffee8,(sexp_sint_t)in_stack_fffffffffffffee0
                                    ,(sexp)CONCAT17(in_stack_fffffffffffffedf,
                                                    CONCAT16(in_stack_fffffffffffffede,
                                                             in_stack_fffffffffffffed8)),
                                    in_stack_fffffffffffffed0,psVar2,
                                    (sexp)CONCAT17(uVar6,in_stack_ffffffffffffff00));
              if (((((ulong)local_90 & 3) != 0) || (local_90->tag != 0x13)) &&
                 ((local_90 = sexp_apply_no_err_handler
                                        (psVar3,psVar1,
                                         (sexp_conflict)CONCAT17(uVar5,in_stack_ffffffffffffff10)),
                  ((ulong)local_90 & 3) != 0 || (local_90->tag != 0x13)))) {
                local_a8 = sexp_make_lit(in_stack_fffffffffffffed0,psVar2);
              }
            }
          }
        }
      }
      else if ((in_RCX != (sexp)0x0) &&
              ((((local_a8->value).stack.length & 3) == 0 &&
               (((local_a8->value).type.name)->tag == 0x1c)))) {
        local_48 = (sexp)0x0;
        local_50 = (((local_a8->value).type.name)->value).type.cpl;
        local_40 = (local_a8->value).type.cpl;
        local_58 = (((local_a8->value).type.name)->value).type.dl;
        local_38 = local_a8;
        psVar3 = sexp_length_op(in_RDI,(sexp)0x0,1,local_50);
        psVar1 = sexp_length_op(in_RDI,(sexp)0x0,1,local_40);
        if (psVar3 == psVar1) {
          while( true ) {
            bVar4 = false;
            if (((ulong)local_40 & 3) == 0) {
              bVar4 = local_40->tag == 6;
            }
            if (!bVar4) break;
            psVar3 = sexp_memq_op(in_RDI,(sexp)0x0,2,(local_50->value).type.name,local_58);
            if ((psVar3 == (sexp)&DAT_0000003e) &&
               ((((local_40->value).stack.length & 3) != 0 ||
                ((((local_40->value).stack.length & 3) == 0 &&
                 (((local_40->value).type.name)->tag == 0x22)))))) {
              local_90 = sexp_cons_op(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                      CONCAT17(in_stack_fffffffffffffedf,
                                               CONCAT16(in_stack_fffffffffffffede,
                                                        in_stack_fffffffffffffed8)),
                                      in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              local_90 = sexp_cons_op(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                      CONCAT17(in_stack_fffffffffffffedf,
                                               CONCAT16(in_stack_fffffffffffffede,
                                                        in_stack_fffffffffffffed8)),
                                      in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              sexp_push_op((sexp)CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT16(in_stack_fffffffffffffede,
                                                   in_stack_fffffffffffffed8)),
                           (sexp_conflict *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              (local_38->value).type.cpl = (local_40->value).type.cpl;
              if (local_48 == (sexp)0x0) {
                (((local_a8->value).type.name)->value).type.cpl = (local_50->value).type.cpl;
              }
              else {
                (local_48->value).type.cpl = (local_50->value).type.cpl;
              }
            }
            else {
              local_48 = local_50;
              local_38 = local_40;
            }
            local_40 = (local_40->value).type.cpl;
            local_50 = (local_50->value).type.cpl;
          }
          psVar3 = simplify(psVar2,ast_00,in_RCX,
                            (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          (((local_a8->value).type.name)->value).type.slots = psVar3;
        }
        else if ((((local_a8->value).stack.length & 3) == 0) &&
                (((local_a8->value).type.name)->tag == 0x1c)) {
          psVar3 = simplify(psVar2,ast_00,in_RCX,
                            (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          (((local_a8->value).type.name)->value).type.slots = psVar3;
        }
      }
      local_60 = local_a8;
      break;
    case 0x1c:
      psVar3 = simplify(local_60,local_38,in_RCX,
                        (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      (local_60->value).type.slots = psVar3;
      break;
    case 0x1d:
      psVar3 = local_60;
      local_90 = simplify(local_60,local_38,in_RCX,
                          (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (((((ulong)local_90 & 3) == 0) && (local_90->tag == 0x22)) || (((ulong)local_90 & 3) != 0))
      {
        psVar2 = local_90;
        if ((((ulong)local_90 & 3) == 0) && (local_90->tag == 0x22)) {
          psVar2 = (local_90->value).type.name;
        }
        if (psVar2 == (sexp)&DAT_0000003e) {
          local_60 = (local_60->value).type.slots;
        }
        else {
          local_60 = (local_60->value).type.cpl;
        }
        local_60 = simplify(psVar3,local_38,in_RCX,
                            (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        (local_60->value).type.name = local_90;
        psVar2 = simplify(psVar3,local_38,in_RCX,
                          (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        (local_60->value).type.cpl = psVar2;
        psVar3 = simplify(psVar3,local_38,in_RCX,
                          (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        (local_60->value).type.slots = psVar3;
      }
      break;
    case 0x1e:
      while( true ) {
        bVar4 = false;
        if (((ulong)local_38 & 3) == 0) {
          bVar4 = local_38->tag == 6;
        }
        if (!bVar4) goto switchD_00154841_caseD_7;
        if (((((local_38->value).type.name)->value).type.name == (local_60->value).type.name) &&
           ((((((local_38->value).type.name)->value).type.cpl)->value).type.name ==
            (((local_60->value).type.cpl)->value).type.cpl)) break;
        local_38 = (local_38->value).type.cpl;
      }
      local_60 = (((((local_38->value).type.name)->value).type.cpl)->value).type.cpl;
      break;
    case 0x1f:
      psVar3 = simplify(local_60,local_38,in_RCX,
                        (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      (local_60->value).type.cpl = psVar3;
      break;
    case 0x21:
      local_a8 = (sexp)&DAT_0000023e;
      local_40 = (local_60->value).type.name;
      psVar3 = local_38;
      psVar2 = local_60;
      while( true ) {
        uVar5 = false;
        if (((ulong)local_40 & 3) == 0) {
          uVar5 = local_40->tag == 6;
        }
        if ((bool)uVar5 == false) break;
        local_90 = simplify(psVar2,psVar3,in_RCX,
                            (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (((((local_40->value).string.offset & 3) != 0) ||
            (((local_40->value).type.cpl)->tag != 6)) ||
           ((((((ulong)local_90 & 3) != 0 || (local_90->tag != 0x22)) &&
             (((ulong)local_90 & 3) == 0)) &&
            (((((ulong)local_90 & 3) != 0 || (local_90->tag != 0x1e)) &&
             ((((ulong)local_90 & 3) != 0 || (local_90->tag != 0x1c)))))))) {
          sexp_push_op((sexp)CONCAT17(in_stack_fffffffffffffedf,
                                      CONCAT16(uVar5,in_stack_fffffffffffffed8)),
                       (sexp_conflict *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        }
        local_40 = (local_40->value).type.cpl;
      }
      if (((((ulong)local_a8 & 3) == 0) && (local_a8->tag == 6)) &&
         ((local_a8->value).type.cpl == (sexp)0x23e)) {
        local_60 = (sexp)(local_a8->value).flonum;
      }
      else {
        psVar3 = sexp_nreverse_op(in_stack_fffffffffffffef8,
                                  (sexp)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0
                                                ),(sexp_sint_t)in_stack_fffffffffffffee8,
                                  in_stack_fffffffffffffee0);
        (local_60->value).type.name = psVar3;
      }
    }
switchD_00154841_caseD_7:
    (in_RDI->value).context.saves = local_70.next;
    local_8 = local_60;
  }
  return local_8;
}

Assistant:

static sexp simplify (sexp ctx, sexp ast, sexp init_substs, sexp lambda) {
  int check;
  sexp ls1, ls2, p1, p2, sv;
  sexp_gc_var5(res, substs, tmp, app, ctx2);
  if (!sexp_pointerp(ast))
    return ast;
  sexp_gc_preserve5(ctx, res, substs, tmp, app, ctx2);
  res = ast;                    /* return the ast as-is by default */
  substs = init_substs;

  switch (sexp_pointer_tag(res)) {

  case SEXP_PAIR:
    /* don't simplify the operator if it's a lambda because we
       simplify that as a special case below, with the appropriate
       substs list */
    app = sexp_list1(ctx, sexp_lambdap(sexp_car(res)) ? sexp_car(res)
                     : (tmp=simplify(ctx, sexp_car(res), substs, lambda)));
    sexp_pair_source(app) = sexp_pair_source(res);
    for (ls1=sexp_cdr(res); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
      sexp_push(ctx, app, tmp=simplify(ctx, sexp_car(ls1), substs, lambda));
      if (sexp_pairp(app)) sexp_pair_source(app) = sexp_pair_source(ls1);
    }
    app = sexp_nreverse(ctx, app);
    /* app now holds a copy of the list, and is the default result
       (res = app below) if we don't replace it with a simplification */
    if (sexp_opcodep(sexp_car(app))) {
      /* opcode app - right now we just constant fold arithmetic */
      if (sexp_opcode_class(sexp_car(app)) == SEXP_OPC_ARITHMETIC) {
        for (check=1, ls1=sexp_cdr(app); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
          if (sexp_pointerp(sexp_car(ls1)) && ! sexp_litp(sexp_car(ls1))) {
            check = 0;
            break;
          }
        }
        if (check) {
          ctx2 = sexp_make_eval_context(ctx, NULL, sexp_context_env(ctx), 0, 0);
          sexp_generate(ctx2, 0, 0, 0, app);
          res = sexp_complete_bytecode(ctx2);
          if (! sexp_exceptionp(res)) {
            tmp = sexp_make_vector(ctx2, 0, SEXP_VOID);
            tmp = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, tmp);
            if (! sexp_exceptionp(tmp)) {
              tmp = sexp_apply_no_err_handler(ctx2, tmp, SEXP_NULL);
              if (! sexp_exceptionp(tmp))
                app = sexp_make_lit(ctx2, tmp);
            }
          }
        }
      }
    } else if (lambda && sexp_lambdap(sexp_car(app))) { /* let */
      p1 = NULL;
      p2 = sexp_lambda_params(sexp_car(app));
      ls1 = app;
      ls2 = sexp_cdr(app);
      sv = sexp_lambda_sv(sexp_car(app));
      /* inline constants and immutable references */
      if (sexp_length(ctx, p2) == sexp_length(ctx, ls2)) {
        for ( ; sexp_pairp(ls2); ls2=sexp_cdr(ls2), p2=sexp_cdr(p2)) {
          if (sexp_not(sexp_memq(ctx, sexp_car(p2), sv))
              && (! sexp_pointerp(sexp_car(ls2)) || sexp_litp(sexp_car(ls2))
                  /* disable inline references for now */
                  || (0 && sexp_refp(sexp_car(ls2))
                      && sexp_lambdap(sexp_ref_loc(sexp_car(ls2)))
                      && sexp_not(sexp_memq(ctx, sexp_ref_name(sexp_car(ls2)),
                                            sexp_lambda_sv(sexp_ref_loc(sexp_car(ls2)))))))) {
            tmp = sexp_cons(ctx, sexp_car(app), sexp_car(ls2));
            tmp = sexp_cons(ctx, sexp_car(p2), tmp);
            sexp_push(ctx, substs, tmp);
            sexp_cdr(ls1) = sexp_cdr(ls2);
            if (p1)
              sexp_cdr(p1) = sexp_cdr(p2);
            else
              sexp_lambda_params(sexp_car(app)) = sexp_cdr(p2);
          } else {
            p1 = p2;
            ls1 = ls2;
          }
        }
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
        /* TODO: Revisit this - it causes GC problems in rare cases. */
        /* if (sexp_nullp(sexp_cdr(app)) */
        /*     && sexp_nullp(sexp_lambda_params(sexp_car(app))) */
        /*     && sexp_nullp(sexp_lambda_defs(sexp_car(app)))) */
        /*   app = sexp_lambda_body(sexp_car(app)); */
      } else if (sexp_lambdap(sexp_car(app))) {
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
      }
    }
    res = app;
    break;

  case SEXP_LAMBDA:
    sexp_lambda_body(res) = simplify(ctx, sexp_lambda_body(res), substs, res);
    break;

  case SEXP_CND:
    tmp = simplify(ctx, sexp_cnd_test(res), substs, lambda);
    if (sexp_litp(tmp) || ! sexp_pointerp(tmp)) {
      res = sexp_not((sexp_litp(tmp) ? sexp_lit_value(tmp) : tmp))
        ? sexp_cnd_fail(res) : sexp_cnd_pass(res);
      res = simplify(ctx, res, substs, lambda);
    } else {
      sexp_cnd_test(res) = tmp;
      simplify_it(sexp_cnd_pass(res));
      simplify_it(sexp_cnd_fail(res));
    }
    break;

  case SEXP_REF:
    tmp = sexp_ref_name(res);
    for (ls1=substs; sexp_pairp(ls1); ls1=sexp_cdr(ls1))
      if ((sexp_caar(ls1) == tmp) && (sexp_cadar(ls1) == sexp_ref_loc(res))) {
        res = sexp_cddar(ls1);
        break;
      }
    break;

  case SEXP_SET:
    simplify_it(sexp_set_value(res));
    break;

  case SEXP_SEQ:
    app = SEXP_NULL;
    for (ls2=sexp_seq_ls(res); sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = simplify(ctx, sexp_car(ls2), substs, lambda);
      if (! (sexp_pairp(sexp_cdr(ls2))
             && (sexp_litp(tmp) || ! sexp_pointerp(tmp) || sexp_refp(tmp)
                 || sexp_lambdap(tmp))))
        sexp_push(ctx, app, tmp);
    }
    if (sexp_pairp(app) && sexp_nullp(sexp_cdr(app)))
      res = sexp_car(app);
    else
      sexp_seq_ls(res) = sexp_nreverse(ctx, app);
    break;

  }

  sexp_gc_release5(ctx);
  return res;
}